

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

int32_t argv2int(jit_State *J,TValue *o)

{
  StrScanFmt SVar1;
  
  if (0xfffeffff < (o->field_2).it) {
    if ((o->field_2).it == 0xfffffffb) {
      SVar1 = lj_strscan_scan((uint8_t *)((ulong)(o->u32).lo + 0x10),o,2);
      if (SVar1 != STRSCAN_ERROR) goto LAB_00131110;
    }
    lj_trace_err(J,LJ_TRERR_BADTYPE);
  }
LAB_00131110:
  return (int)o->n;
}

Assistant:

static int32_t argv2int(jit_State *J, TValue *o)
{
  if (!lj_strscan_numberobj(o))
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  return tvisint(o) ? intV(o) : lj_num2int(numV(o));
}